

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# consolelog.hpp
# Opt level: O0

void __thiscall
github111116::ConsoleLogger::info<char[25],int,char[8]>
          (ConsoleLogger *this,char (*args) [25],int *args_1,char (*args_2) [8])

{
  mutex *in_RCX;
  char (*in_RDX) [25];
  ConsoleLogger *in_RSI;
  char (*in_RDI) [8];
  
  if (*(int *)(in_RDI[0xd] + 4) < 2) {
    std::mutex::lock(in_RCX);
    if ((in_RDI[0xd][0] & 1U) != 0) {
      std::operator<<((ostream *)*in_RDI,(string *)(in_RDI + 1));
    }
    std::operator<<((ostream *)*in_RDI,"[i] ");
    if ((in_RDI[0xd][0] & 1U) != 0) {
      std::operator<<((ostream *)*in_RDI,"\x1b[0m");
    }
    print<char[25],int,char[8]>(in_RSI,in_RDX,(int *)in_RCX,in_RDI);
    std::mutex::unlock((mutex *)0x18eafe);
  }
  return;
}

Assistant:

void ConsoleLogger::info(const Args&... args)
{
	if (loglevel > 1) return;
	mtx.lock();
	if (colored) out << infoColor;
	out << "[i] ";
	if (colored) out << "\033[0m";
	print(args...);
	mtx.unlock();
}